

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

ssize_t __thiscall r_code::SysObject::write(SysObject *this,int __fd,void *__buf,size_t __n)

{
  pointer pAVar1;
  pointer pAVar2;
  SysView *pSVar3;
  Atom *pAVar4;
  pointer puVar5;
  uint *puVar6;
  SysView **ppSVar7;
  pointer ppSVar8;
  pointer puVar9;
  undefined4 in_register_00000034;
  uint32_t *puVar10;
  ulong i;
  ulong i_00;
  long lVar11;
  ulong i_01;
  pointer i_02;
  
  puVar10 = (uint32_t *)CONCAT44(in_register_00000034,__fd);
  *puVar10 = this->oid;
  pAVar1 = (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar2 = (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar10[1] = (uint32_t)((ulong)((long)pAVar1 - (long)pAVar2) >> 2);
  puVar5 = (this->super_ImageObject).references.m_vector.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar9 = (this->super_ImageObject).references.m_vector.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar10[2] = (uint32_t)((ulong)((long)puVar9 - (long)puVar5) >> 2);
  puVar10[3] = (uint32_t)
               ((ulong)((long)(this->markers).m_vector.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->markers).m_vector.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2);
  puVar10[4] = (uint32_t)
               ((ulong)((long)(this->views).m_vector.
                              super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->views).m_vector.
                             super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (pAVar1 == pAVar2) {
    i_01 = 0;
  }
  else {
    i_01 = 0;
    do {
      pAVar4 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,i_01);
      puVar10[i_01 + 5] = pAVar4->atom;
      i_01 = i_01 + 1;
    } while (i_01 < (ulong)((long)(this->super_ImageObject).code.m_vector.
                                  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->super_ImageObject).code.m_vector.
                                  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2));
    puVar5 = (this->super_ImageObject).references.m_vector.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar9 = (this->super_ImageObject).references.m_vector.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (puVar9 == puVar5) {
    i = 0;
  }
  else {
    i = 0;
    do {
      puVar6 = vector<unsigned_int>::operator[](&(this->super_ImageObject).references,i);
      puVar10[i_01 + i + 5] = *puVar6;
      i = i + 1;
    } while (i < (ulong)((long)(this->super_ImageObject).references.m_vector.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ImageObject).references.m_vector.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if ((this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    i_00 = 0;
  }
  else {
    i_00 = 0;
    do {
      puVar6 = vector<unsigned_int>::operator[](&this->markers,i_00);
      puVar10[i_01 + i + i_00 + 5] = *puVar6;
      i_00 = i_00 + 1;
    } while (i_00 < (ulong)((long)(this->markers).m_vector.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->markers).m_vector.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  ppSVar8 = (this->views).m_vector.
            super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar8 !=
      (this->views).m_vector.
      super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar11 = 0;
    i_02 = (pointer)0x0;
    do {
      ppSVar7 = vector<r_code::SysView_*>::operator[](&this->views,(size_t)i_02);
      (*((*ppSVar7)->super_ImageObject)._vptr_ImageObject[2])
                (*ppSVar7,puVar10 + i_01 + i + i_00 + lVar11 + 5);
      ppSVar7 = vector<r_code::SysView_*>::operator[](&this->views,(size_t)i_02);
      pSVar3 = *ppSVar7;
      lVar11 = ((long)(pSVar3->super_ImageObject).references.m_vector.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pSVar3->super_ImageObject).references.m_vector.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) +
               ((long)(pSVar3->super_ImageObject).code.m_vector.
                      super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pSVar3->super_ImageObject).code.m_vector.
                      super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) + lVar11 + 2;
      i_02 = (pointer)((long)i_02 + 1);
      ppSVar8 = (pointer)((long)(this->views).m_vector.
                                super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->views).m_vector.
                                super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
    } while (i_02 < ppSVar8);
  }
  return (ssize_t)ppSVar8;
}

Assistant:

void SysObject::write(uint32_t *data)
{
    data[0] = oid;
    data[1] = code.size();
    data[2] = references.size();
    data[3] = markers.size();
    data[4] = views.size();
    size_t i;
    size_t j;
    size_t k;
    size_t l;

    for (i = 0; i < code.size(); ++i) {
        data[5 + i] = code[i].atom;
    }

    for (j = 0; j < references.size(); ++j) {
        data[5 + i + j] = references[j];
    }

    for (k = 0; k < markers.size(); ++k) {
        data[5 + i + j + k] = markers[k];
    }

    size_t offset = 0;

    for (l = 0; l < views.size(); ++l) {
        views[l]->write(data + 5 + i + j + k + offset);
        offset += views[l]->get_size();
    }
}